

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

int VP8IteratorProgress(VP8EncIterator *it,int delta)

{
  int iVar1;
  int percent_00;
  int in_ESI;
  long in_RDI;
  int percent;
  int done;
  VP8Encoder *enc;
  int *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if ((in_ESI == 0) || (*(long *)(*(long *)(*(long *)(in_RDI + 0x28) + 8) + 0x90) == 0)) {
    local_4 = 1;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x150) - *(int *)(in_RDI + 0x14c);
    if (*(int *)(in_RDI + 0x150) < 1) {
      percent_00 = *(int *)(in_RDI + 0x154);
    }
    else {
      percent_00 = *(int *)(in_RDI + 0x154) + (in_ESI * iVar1) / *(int *)(in_RDI + 0x150);
    }
    local_4 = WebPReportProgress((WebPPicture *)CONCAT44(iVar1,percent_00),percent_00,
                                 in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

int VP8IteratorProgress(const VP8EncIterator* const it, int delta) {
  VP8Encoder* const enc = it->enc;
  if (delta && enc->pic->progress_hook != NULL) {
    const int done = it->count_down0 - it->count_down;
    const int percent = (it->count_down0 <= 0)
                      ? it->percent0
                      : it->percent0 + delta * done / it->count_down0;
    return WebPReportProgress(enc->pic, percent, &enc->percent);
  }
  return 1;
}